

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

UINT8 __thiscall GYMPlayer::UnloadFile(GYMPlayer *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  GYMPlayer *local_18;
  GYMPlayer *this_local;
  
  if ((this->_playState & 1) == 0) {
    this->_playState = '\0';
    this->_dLoad = (DATA_LOADER *)0x0;
    this->_fileData = (UINT8 *)0x0;
    local_18 = this;
    memset(&local_30,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->_decFData,&local_30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
    (this->_fileHdr).hasHeader = '\0';
    (this->_fileHdr).dataOfs = 0;
    std::vector<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>::clear
              (&this->_devices);
    this_local._7_1_ = '\0';
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 GYMPlayer::UnloadFile(void)
{
	if (_playState & PLAYSTATE_PLAY)
		return 0xFF;
	
	_playState = 0x00;
	_dLoad = NULL;
	_fileData = NULL;
	_decFData = std::vector<UINT8>();	// free allocated memory
	_fileHdr.hasHeader = 0;
	_fileHdr.dataOfs = 0x00;
	_devices.clear();
	
	return 0x00;
}